

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal.hpp
# Opt level: O0

int __thiscall
unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::cmp
          (basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *this,void *param_1,
          void *param_2)

{
  key_view b;
  key_view a;
  int iVar1;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *this_local;
  key_view key2_local;
  
  a._M_ptr = *(pointer *)&this->field_0;
  a._M_extent._M_extent_value = *(size_t *)((long)&this->field_0 + 8);
  b._M_extent._M_extent_value = (size_t)param_2;
  b._M_ptr = (pointer)param_1;
  iVar1 = compare(a,b);
  return iVar1;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr int cmp(key_view key2) const noexcept {
    if constexpr (std::is_same_v<KeyType, unodb::key_view>) {
      // variable length keys
      return compare(key, key2);
    } else {
      // fixed width keys
      return compare(&key, sizeof(KeyType), key2.data(), key2.size_bytes());
    }
  }